

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::init
          (UserDefinedIOCase *this,EVP_PKEY_CTX *ctx)

{
  Precision *pPVar1;
  deInt32 *pdVar2;
  undefined1 *puVar3;
  IOType IVar4;
  TessControlOutArraySize TVar5;
  ContextInfo *pCVar6;
  Context *pCVar7;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar8;
  bool bVar9;
  UserDefinedIOCase *pUVar10;
  int iVar11;
  int iVar12;
  RenderTarget *pRVar13;
  long *plVar14;
  IOBlock *pIVar15;
  StructType *pSVar16;
  anon_struct_8_2_bfd9d0cb_for_basic aVar17;
  pointer pMVar18;
  pointer pMVar19;
  long *plVar20;
  anon_struct_8_2_bfd9d0cb_for_basic *paVar21;
  pointer pSVar22;
  SharedPtrStateBase *pSVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  TestError *this_00;
  undefined8 uVar25;
  undefined1 usePointMode;
  size_type *psVar26;
  _Rb_tree_node_base *p_Var27;
  _Base_ptr p_Var28;
  undefined **ppuVar29;
  size_type *psVar30;
  Context *pCVar31;
  Context *code;
  int precision;
  int precision_00;
  TessPrimitiveType extraout_EDX;
  TessPrimitiveType extraout_EDX_00;
  TessPrimitiveType extraout_EDX_01;
  TessPrimitiveType extraout_EDX_02;
  TessPrimitiveType extraout_EDX_03;
  TessPrimitiveType primType;
  char *pcVar32;
  anon_struct_8_2_bfd9d0cb_for_basic extraout_RDX;
  long lVar33;
  pointer pcVar34;
  char *pcVar35;
  undefined1 auVar36 [8];
  undefined1 *puVar37;
  StructType *pSVar38;
  long lVar39;
  deInt32 *pdVar40;
  int *piVar41;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  blockMembers;
  Variable var1;
  Variable var0;
  string tessellationEvaluationTemplate;
  string fragmentShaderTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string tcsStatements;
  string tesStatements;
  string inMaybePatch;
  string outMaybePatch;
  string tcsDeclarations;
  string vertexAttrArrayInputSize;
  string tesDeclarations;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [39];
  char local_481;
  undefined1 local_480 [8];
  undefined1 local_478 [8];
  undefined1 local_470 [8];
  undefined1 auStack_468 [16];
  undefined1 local_458 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_440;
  VarType local_430;
  bool local_418;
  UserDefinedIOCase *local_410;
  ShaderProgram *local_408;
  size_type *local_400;
  value_type local_3f8;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  Data local_3a8;
  bool local_398;
  ios_base local_368 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_348;
  deUint32 local_330;
  undefined1 local_328 [200];
  undefined1 local_260 [24];
  long lStack_248;
  VertexIOArraySize local_23c;
  undefined1 local_238 [32];
  Context *local_218;
  undefined1 local_210 [16];
  long lStack_200;
  ContextInfo *local_1f8 [2];
  undefined1 local_1e8 [33];
  undefined7 uStack_1c7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  bool local_1a8;
  undefined7 uStack_1a7;
  _Base_ptr local_198;
  size_t local_190;
  _Base_ptr local_188;
  _Base_ptr p_Stack_180;
  _Rb_tree_node_base *local_178;
  _Base_ptr local_170;
  _Rb_tree_node_base local_168;
  undefined1 local_148 [16];
  string local_138;
  _Base_ptr local_118;
  undefined8 local_110;
  undefined1 local_108 [24];
  _Base_ptr local_f0;
  long local_e8;
  undefined1 local_e0 [24];
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  value_type local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar13->m_width,
             (RenderTarget *)(ulong)(uint)pRVar13->m_height,0x100);
  local_408 = (ShaderProgram *)CONCAT44(local_408._4_4_,this->m_ioType);
  local_23c = this->m_vertexIOArraySize;
  if (local_23c == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY) {
    pCVar6 = ((this->super_TestCase).m_context)->m_contextInfo;
    iVar12 = (*pCVar6->_vptr_ContextInfo[2])(pCVar6,0x8e7d);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
    std::ostream::operator<<((ostringstream *)local_3d8,iVar12);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
    std::ios_base::~ios_base(local_368);
  }
  else {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    if (local_23c == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
      pcVar35 = "gl_MaxPatchVertices";
      pcVar32 = "";
    }
    else {
      if (local_23c != VERTEX_IO_ARRAY_SIZE_IMPLICIT) {
        uVar25 = std::__throw_logic_error("basic_string::_M_construct null not valid");
        de::
        SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
        ::~SharedPtr((SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>
                      *)local_4b8);
        Variable::~Variable((Variable *)local_458);
        Variable::~Variable((Variable *)local_3d8);
        glu::VarType::~VarType((VarType *)local_260);
        glu::VarType::~VarType((VarType *)&local_218);
        if ((bool *)local_1b8._M_allocated_capacity != &local_1a8) {
          operator_delete((void *)local_1b8._M_allocated_capacity,CONCAT71(uStack_1a7,local_1a8) + 1
                         );
        }
        if (local_118 != (_Base_ptr)local_108) {
          operator_delete(local_118,CONCAT71(local_108._1_7_,local_108[0]) + 1);
        }
        if ((pointer)local_1e8._16_8_ != (pointer)(local_1e8 + 0x20)) {
          operator_delete((void *)local_1e8._16_8_,CONCAT71(uStack_1c7,local_1e8[0x20]) + 1);
        }
        if (local_168._M_left != (_Base_ptr)local_148) {
          operator_delete(local_168._M_left,CONCAT71(local_148._1_7_,local_148[0]) + 1);
        }
        if (local_198 != (_Base_ptr)&local_188) {
          operator_delete(local_198,(ulong)((long)&local_188->_M_color + 1));
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar25);
      }
      pcVar32 = "";
      pcVar35 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_148 + 0x10),pcVar35,pcVar32);
  }
  pcVar34 = local_458 + 0x10;
  local_458._8_8_ = (pointer)0x0;
  local_458._16_8_ = local_458._16_8_ & 0xffffffffffffff00;
  local_458._0_8_ = pcVar34;
  plVar14 = (long *)std::__cxx11::string::append(local_458);
  local_3d8._0_8_ = local_3c8;
  psVar26 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar26) {
    local_3c8._0_8_ = *psVar26;
    local_3c8._8_8_ = plVar14[3];
  }
  else {
    local_3c8._0_8_ = *psVar26;
    local_3d8._0_8_ = (size_type *)*plVar14;
  }
  local_3d8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar14 + 1);
  *plVar14 = (long)psVar26;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_3d8);
  local_178 = &local_168;
  p_Var27 = (_Rb_tree_node_base *)(plVar14 + 2);
  if ((_Rb_tree_node_base *)*plVar14 == p_Var27) {
    local_168._0_8_ = *(undefined8 *)p_Var27;
    local_168._M_parent = (_Base_ptr)plVar14[3];
  }
  else {
    local_168._0_8_ = *(undefined8 *)p_Var27;
    local_178 = (_Rb_tree_node_base *)*plVar14;
  }
  local_170 = (_Base_ptr)plVar14[1];
  *plVar14 = (long)p_Var27;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
    operator_delete((void *)local_3d8._0_8_,local_3c8._0_8_ + 1);
  }
  if ((pointer)local_458._0_8_ != pcVar34) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  local_458._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_458._16_8_ = local_458._16_8_ & 0xffffffffffffff00;
  local_458._0_8_ = pcVar34;
  plVar14 = (long *)std::__cxx11::string::append(local_458);
  local_3d8._0_8_ = local_3c8;
  plVar20 = plVar14 + 2;
  if ((long *)*plVar14 == plVar20) {
    local_3c8._0_8_ = *plVar20;
    local_3c8._8_8_ = plVar14[3];
  }
  else {
    local_3c8._0_8_ = *plVar20;
    local_3d8._0_8_ = (long *)*plVar14;
  }
  local_3d8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar14 + 1);
  *plVar14 = (long)plVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_3d8);
  local_198 = (_Base_ptr)&local_188;
  p_Var28 = (_Base_ptr)(plVar14 + 2);
  if ((_Base_ptr)*plVar14 == p_Var28) {
    local_188 = *(_Base_ptr *)p_Var28;
    p_Stack_180 = (_Base_ptr)plVar14[3];
  }
  else {
    local_188 = *(_Base_ptr *)p_Var28;
    local_198 = (_Base_ptr)*plVar14;
  }
  local_190 = plVar14[1];
  *plVar14 = (long)p_Var28;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
  }
  if ((pointer)local_458._0_8_ != pcVar34) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  IVar4 = this->m_ioType;
  local_168._M_left = (_Base_ptr)local_148;
  local_168._M_right = (_Base_ptr)0x0;
  local_148[0] = _S_red;
  local_1e8._16_8_ = local_1e8 + 0x20;
  local_1e8._24_8_ = (pointer)0x0;
  local_1e8[0x20] = 0;
  local_118 = (_Base_ptr)local_108;
  local_110 = 0;
  local_108[0] = _S_red;
  local_1b8._M_allocated_capacity = (size_type)&local_1a8;
  local_1b8._8_8_ = 0;
  local_1a8 = false;
  local_3d8._0_8_ = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"S","");
  local_3b8._0_8_ = (pointer)0x0;
  local_3b8._8_8_ = (pointer)0x0;
  local_3a8._0_8_ = (pointer)0x0;
  std::vector<glu::StructType,_std::allocator<glu::StructType>_>::emplace_back<glu::StructType>
            (&this->m_structTypes,(StructType *)local_3d8);
  glu::StructType::~StructType((StructType *)local_3d8);
  glu::VarType::VarType((VarType *)&local_218,TYPE_FLOAT,PRECISION_HIGHP);
  pSVar38 = (this->m_structTypes).
            super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>._M_impl.
            super__Vector_impl_data._M_finish + -1;
  glu::VarType::VarType((VarType *)local_260,pSVar38);
  glu::VarType::VarType((VarType *)local_3d8,TYPE_INT,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar38,"x",(VarType *)local_3d8);
  glu::VarType::~VarType((VarType *)local_3d8);
  glu::VarType::VarType((VarType *)local_3d8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar38,"y",(VarType *)local_3d8);
  glu::VarType::~VarType((VarType *)local_3d8);
  local_410 = this;
  if ((IVar4 < IO_TYPE_LAST & 0x2cU >> ((byte)IVar4 & 0x1f)) == 0) {
    local_458._0_8_ = local_458 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"in_te_s","");
    Variable::Variable((Variable *)local_3d8,(string *)local_458,(VarType *)local_260,
                       this->m_ioType != IO_TYPE_PER_PATCH);
    if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    local_4b8._0_8_ = (pointer)local_4a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"in_te_f","");
    Variable::Variable((Variable *)local_458,(string *)local_4b8,(VarType *)&local_218,
                       this->m_ioType != IO_TYPE_PER_PATCH);
    if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
      operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
    }
    local_481 = this->m_ioType != IO_TYPE_PER_PATCH_ARRAY;
    if ((bool)local_481) {
      pMVar18 = (pointer)operator_new(0x48);
      (pMVar18->name)._M_dataplus._M_p = (pointer)&PTR__Variable_021558d0;
      (pMVar18->name)._M_string_length = (size_type)((long)&(pMVar18->name).field_2 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(pMVar18->name)._M_string_length,local_3d8._8_8_,
                 (undefined1 *)((long)(Type *)local_3d8._8_8_ + local_3c8._0_8_));
      glu::VarType::VarType((VarType *)&(pMVar18->type).m_data.basic,(VarType *)(local_3b8 + 8));
      *(bool *)&pMVar18[1].name._M_string_length = local_398;
      local_4b8._8_8_ = (pointer)0x0;
      local_4b8._0_8_ = pMVar18;
      pMVar19 = (pointer)operator_new(0x20);
      *(undefined4 *)&(pMVar19->name)._M_string_length = 0;
      *(undefined4 *)((long)&(pMVar19->name)._M_string_length + 4) = 0;
      (pMVar19->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_02155890;
      (pMVar19->name).field_2._M_allocated_capacity = (size_type)pMVar18;
      *(undefined4 *)&(pMVar19->name)._M_string_length = 1;
      *(undefined4 *)((long)&(pMVar19->name)._M_string_length + 4) = 1;
      local_4b8._8_8_ = pMVar19;
      std::
      vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
      ::push_back(&local_410->m_tcsOutputs,(value_type *)local_4b8);
      uVar25 = local_4b8._8_8_;
      psVar26 = &(pMVar19->name)._M_string_length;
      LOCK();
      *(int *)psVar26 = (int)*psVar26 + -1;
      UNLOCK();
      if ((int)*psVar26 == 0) {
        local_4b8._0_8_ = (pointer)0x0;
        (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 0x10))(local_4b8._8_8_);
      }
      LOCK();
      piVar41 = (int *)((long)&((string *)uVar25)->_M_string_length + 4);
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if ((*piVar41 == 0) && ((pointer)local_4b8._8_8_ != (pointer)0x0)) {
        (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 8))();
      }
      pMVar18 = (pointer)operator_new(0x48);
      (pMVar18->name)._M_dataplus._M_p = (pointer)&PTR__Variable_021558d0;
      (pMVar18->name)._M_string_length = (size_type)((long)&(pMVar18->name).field_2 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(pMVar18->name)._M_string_length,local_3d8._8_8_,
                 (undefined1 *)((long)(Type *)local_3d8._8_8_ + local_3c8._0_8_));
      glu::VarType::VarType((VarType *)&(pMVar18->type).m_data.basic,(VarType *)(local_3b8 + 8));
      *(bool *)&pMVar18[1].name._M_string_length = local_398;
      local_4b8._8_8_ = (pointer)0x0;
      local_4b8._0_8_ = pMVar18;
      pMVar19 = (pointer)operator_new(0x20);
      *(undefined4 *)&(pMVar19->name)._M_string_length = 0;
      *(undefined4 *)((long)&(pMVar19->name)._M_string_length + 4) = 0;
      (pMVar19->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_02155890;
      (pMVar19->name).field_2._M_allocated_capacity = (size_type)pMVar18;
      *(undefined4 *)&(pMVar19->name)._M_string_length = 1;
      *(undefined4 *)((long)&(pMVar19->name)._M_string_length + 4) = 1;
      local_4b8._8_8_ = pMVar19;
      std::
      vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
      ::push_back(&local_410->m_tesInputs,(value_type *)local_4b8);
      uVar25 = local_4b8._8_8_;
      psVar26 = &(pMVar19->name)._M_string_length;
      LOCK();
      *(int *)psVar26 = (int)*psVar26 + -1;
      UNLOCK();
      if ((int)*psVar26 == 0) {
        local_4b8._0_8_ = (pointer)0x0;
        (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 0x10))(local_4b8._8_8_);
      }
      LOCK();
      piVar41 = (int *)((long)&((string *)uVar25)->_M_string_length + 4);
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if ((*piVar41 == 0) && ((pointer)local_4b8._8_8_ != (pointer)0x0)) {
        (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 8))();
      }
    }
    pMVar18 = (pointer)operator_new(0x48);
    (pMVar18->name)._M_dataplus._M_p = (pointer)&PTR__Variable_021558d0;
    (pMVar18->name)._M_string_length = (size_type)((long)&(pMVar18->name).field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pMVar18->name)._M_string_length,local_458._8_8_,
               (char *)(local_458._8_8_ + local_458._16_8_));
    glu::VarType::VarType((VarType *)&(pMVar18->type).m_data.basic,&local_430);
    *(bool *)&pMVar18[1].name._M_string_length = local_418;
    local_4b8._8_8_ = (pointer)0x0;
    local_4b8._0_8_ = pMVar18;
    pMVar19 = (pointer)operator_new(0x20);
    *(undefined4 *)&(pMVar19->name)._M_string_length = 0;
    *(undefined4 *)((long)&(pMVar19->name)._M_string_length + 4) = 0;
    (pMVar19->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_02155890;
    (pMVar19->name).field_2._M_allocated_capacity = (size_type)pMVar18;
    *(undefined4 *)&(pMVar19->name)._M_string_length = 1;
    *(undefined4 *)((long)&(pMVar19->name)._M_string_length + 4) = 1;
    local_4b8._8_8_ = pMVar19;
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&local_410->m_tcsOutputs,(value_type *)local_4b8);
    uVar25 = local_4b8._8_8_;
    psVar26 = &(pMVar19->name)._M_string_length;
    LOCK();
    *(int *)psVar26 = (int)*psVar26 + -1;
    UNLOCK();
    if ((int)*psVar26 == 0) {
      local_4b8._0_8_ = (pointer)0x0;
      (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 0x10))(local_4b8._8_8_);
    }
    LOCK();
    piVar41 = (int *)((long)&((string *)uVar25)->_M_string_length + 4);
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if ((*piVar41 == 0) && ((pointer)local_4b8._8_8_ != (pointer)0x0)) {
      (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 8))();
    }
    pMVar18 = (pointer)operator_new(0x48);
    (pMVar18->name)._M_dataplus._M_p = (pointer)&PTR__Variable_021558d0;
    (pMVar18->name)._M_string_length = (size_type)((long)&(pMVar18->name).field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pMVar18->name)._M_string_length,local_458._8_8_,
               (char *)(local_458._8_8_ + local_458._16_8_));
    glu::VarType::VarType((VarType *)&(pMVar18->type).m_data.basic,&local_430);
    *(bool *)&pMVar18[1].name._M_string_length = local_418;
    local_4b8._8_8_ = (pointer)0x0;
    local_4b8._0_8_ = pMVar18;
    pMVar19 = (pointer)operator_new(0x20);
    *(undefined4 *)&(pMVar19->name)._M_string_length = 0;
    *(undefined4 *)((long)&(pMVar19->name)._M_string_length + 4) = 0;
    (pMVar19->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_02155890;
    (pMVar19->name).field_2._M_allocated_capacity = (size_type)pMVar18;
    *(undefined4 *)&(pMVar19->name)._M_string_length = 1;
    *(undefined4 *)((long)&(pMVar19->name)._M_string_length + 4) = 1;
    local_4b8._8_8_ = pMVar19;
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&local_410->m_tesInputs,(value_type *)local_4b8);
    uVar25 = local_4b8._8_8_;
    psVar26 = &(pMVar19->name)._M_string_length;
    LOCK();
    *(int *)psVar26 = (int)*psVar26 + -1;
    UNLOCK();
    if ((int)*psVar26 == 0) {
      local_4b8._0_8_ = (pointer)0x0;
      (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 0x10))(local_4b8._8_8_);
    }
    this = local_410;
    LOCK();
    piVar41 = (int *)((long)&((string *)uVar25)->_M_string_length + 4);
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if ((*piVar41 == 0) && ((pointer)local_4b8._8_8_ != (pointer)0x0)) {
      (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 8))();
    }
    local_458._0_8_ = &PTR__Variable_021558d0;
    glu::VarType::~VarType(&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._8_8_ != &aStack_440) {
      operator_delete((void *)local_458._8_8_,aStack_440._0_8_ + 1);
    }
    local_3d8._0_8_ = &PTR__Variable_021558d0;
    glu::VarType::~VarType((VarType *)(local_3b8 + 8));
    if (local_3d8._8_8_ != (long)local_3c8 + 8) {
      operator_delete((void *)local_3d8._8_8_,local_3c8._8_8_ + 1);
    }
  }
  else {
    glu::VarType::VarType((VarType *)local_3d8,(VarType *)&local_218,2);
    ppuVar29 = (undefined **)(local_458 + 0x10);
    glu::StructType::addMember(pSVar38,"z",(VarType *)local_3d8);
    glu::VarType::~VarType((VarType *)local_3d8);
    local_4b8._0_8_ = (pointer)0x0;
    local_4b8._8_8_ = (pointer)0x0;
    local_4a8._0_8_ = (pointer)0x0;
    if (this->m_ioType != IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
      local_458._0_8_ = ppuVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"blockS","");
      IOBlock::Member::Member((Member *)local_3d8,(string *)local_458,(VarType *)local_260);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                   *)local_4b8,(value_type *)local_3d8);
      glu::VarType::~VarType((VarType *)local_3b8);
      if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
      }
      if ((undefined **)local_458._0_8_ != ppuVar29) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
    }
    local_458._0_8_ = ppuVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"blockFa","");
    glu::VarType::VarType((VarType *)local_480,(VarType *)&local_218,3);
    IOBlock::Member::Member((Member *)local_3d8,(string *)local_458,(VarType *)local_480);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                 *)local_4b8,(value_type *)local_3d8);
    glu::VarType::~VarType((VarType *)local_3b8);
    if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
    }
    glu::VarType::~VarType((VarType *)local_480);
    if ((undefined **)local_458._0_8_ != ppuVar29) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    local_458._0_8_ = ppuVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"blockSa","");
    glu::VarType::VarType((VarType *)local_480,(VarType *)local_260,2);
    IOBlock::Member::Member((Member *)local_3d8,(string *)local_458,(VarType *)local_480);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                 *)local_4b8,(value_type *)local_3d8);
    glu::VarType::~VarType((VarType *)local_3b8);
    if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
    }
    glu::VarType::~VarType((VarType *)local_480);
    if ((undefined **)local_458._0_8_ != ppuVar29) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    local_458._0_8_ = ppuVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"blockF","");
    IOBlock::Member::Member((Member *)local_3d8,(string *)local_458,(VarType *)&local_218);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                 *)local_4b8,(value_type *)local_3d8);
    glu::VarType::~VarType((VarType *)local_3b8);
    if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
    }
    if ((undefined **)local_458._0_8_ != ppuVar29) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    pIVar15 = (IOBlock *)operator_new(0x60);
    local_3d8._0_8_ = local_3c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"TheBlock","");
    local_458._0_8_ = ppuVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"tcBlock","");
    IOBlock::IOBlock(pIVar15,(string *)local_3d8,(string *)local_458,
                     (vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                      *)local_4b8);
    local_478 = (undefined1  [8])0x0;
    local_480 = (undefined1  [8])pIVar15;
    pSVar16 = (StructType *)operator_new(0x20);
    *(undefined4 *)&(pSVar16->m_typeName)._M_string_length = 0;
    *(undefined4 *)((long)&(pSVar16->m_typeName)._M_string_length + 4) = 0;
    (pSVar16->m_typeName)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_02155890;
    *(IOBlock **)&(pSVar16->m_typeName).field_2 = pIVar15;
    *(undefined4 *)&(pSVar16->m_typeName)._M_string_length = 1;
    *(undefined4 *)((long)&(pSVar16->m_typeName)._M_string_length + 4) = 1;
    local_478 = (undefined1  [8])pSVar16;
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tcsOutputs,(value_type *)local_480);
    auVar36 = local_478;
    psVar26 = &(pSVar16->m_typeName)._M_string_length;
    LOCK();
    *(int *)psVar26 = (int)*psVar26 + -1;
    UNLOCK();
    if ((int)*psVar26 == 0) {
      local_480._0_4_ = TYPE_INVALID;
      local_480._4_4_ = PRECISION_LOWP;
      (**(code **)((((string *)local_478)->_M_dataplus)._M_p + 0x10))(local_478);
    }
    LOCK();
    pPVar1 = &(((Data *)((long)auVar36 + 8))->basic).precision;
    *pPVar1 = *pPVar1 - PRECISION_MEDIUMP;
    UNLOCK();
    if ((*pPVar1 == PRECISION_LOWP) && (local_478 != (undefined1  [8])0x0)) {
      (**(code **)((((string *)local_478)->_M_dataplus)._M_p + 8))();
    }
    if ((undefined **)local_458._0_8_ != ppuVar29) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
    }
    pIVar15 = (IOBlock *)operator_new(0x60);
    local_3d8._0_8_ = local_3c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"TheBlock","");
    local_458._0_8_ = ppuVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"teBlock","");
    IOBlock::IOBlock(pIVar15,(string *)local_3d8,(string *)local_458,
                     (vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                      *)local_4b8);
    local_478 = (undefined1  [8])0x0;
    local_480 = (undefined1  [8])pIVar15;
    aVar17 = (anon_struct_8_2_bfd9d0cb_for_basic)operator_new(0x20);
    *(undefined4 *)((long)aVar17 + 8) = 0;
    *(undefined4 *)((long)aVar17 + 0xc) = 0;
    *(undefined ***)aVar17 = &PTR__SharedPtrState_02155890;
    *(IOBlock **)((long)aVar17 + 0x10) = pIVar15;
    *(undefined4 *)((long)aVar17 + 8) = 1;
    *(undefined4 *)((long)aVar17 + 0xc) = 1;
    local_478 = (undefined1  [8])aVar17;
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&this->m_tesInputs,(value_type *)local_480);
    auVar36 = local_478;
    piVar41 = (int *)((long)aVar17 + 8);
    LOCK();
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if (*piVar41 == 0) {
      local_480._0_4_ = TYPE_INVALID;
      local_480._4_4_ = PRECISION_LOWP;
      (**(code **)((((string *)local_478)->_M_dataplus)._M_p + 0x10))(local_478);
    }
    LOCK();
    pPVar1 = &(((Data *)((long)auVar36 + 8))->basic).precision;
    *pPVar1 = *pPVar1 - PRECISION_MEDIUMP;
    UNLOCK();
    if ((*pPVar1 == PRECISION_LOWP) &&
       ((anon_struct_8_2_bfd9d0cb_for_basic)local_478 != (anon_struct_8_2_bfd9d0cb_for_basic)0x0)) {
      (**(code **)((((string *)local_478)->_M_dataplus)._M_p + 8))();
    }
    if ((undefined **)local_458._0_8_ != ppuVar29) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    }
    if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
      operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
               *)local_4b8);
    local_481 = '\x01';
  }
  aVar17 = (anon_struct_8_2_bfd9d0cb_for_basic)((long)local_478 + 8);
  local_480 = (undefined1  [8])aVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"in_tc_attr","");
  Variable::Variable((Variable *)local_3d8,(string *)local_480,(VarType *)&local_218,true);
  Variable::declareArray((string *)local_4b8,(Variable *)local_3d8,(string *)(local_148 + 0x10));
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_4b8,0,(char *)0x0,0x1a420ed);
  psVar26 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar26) {
    local_458._16_8_ = *psVar26;
    aStack_440._M_allocated_capacity = plVar14[3];
    local_458._0_8_ = local_458 + 0x10;
  }
  else {
    local_458._16_8_ = *psVar26;
    local_458._0_8_ = (size_type *)*plVar14;
  }
  local_458._8_8_ = plVar14[1];
  *plVar14 = (long)psVar26;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_168._M_left,local_458._0_8_);
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
    operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
  }
  local_3d8._0_8_ = &PTR__Variable_021558d0;
  glu::VarType::~VarType((VarType *)(local_3b8 + 8));
  if (local_3d8._8_8_ != (long)local_3c8 + 8) {
    operator_delete((void *)local_3d8._8_8_,local_3c8._8_8_ + 1);
  }
  if ((anon_struct_8_2_bfd9d0cb_for_basic)local_480 != aVar17) {
    operator_delete((void *)local_480,(ulong)((long)local_470 + 1));
  }
  if (local_481 != '\0') {
    glu::decl::DeclareStructType::DeclareStructType((DeclareStructType *)local_458,pSVar38,0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
    glu::decl::operator<<((ostream *)local_3d8,(DeclareStructType *)local_458);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
    std::ios_base::~ios_base(local_368);
    plVar14 = (long *)std::__cxx11::string::append(local_480);
    local_4b8._0_8_ = local_4a8;
    pMVar18 = (pointer)(plVar14 + 2);
    if ((pointer)*plVar14 == pMVar18) {
      local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
      local_4a8._8_8_ = plVar14[3];
    }
    else {
      local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
      local_4b8._0_8_ = (pointer)*plVar14;
    }
    local_4b8._8_8_ = plVar14[1];
    *plVar14 = (long)pMVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_168._M_left,local_4b8._0_8_);
    if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
      operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
    }
    if ((anon_struct_8_2_bfd9d0cb_for_basic)local_480 != aVar17) {
      operator_delete((void *)local_480,(ulong)((long)local_470 + 1));
    }
    glu::StructType::~StructType((StructType *)local_458);
  }
  local_108._16_8_ = pSVar38;
  std::__cxx11::string::append(local_1e8 + 0x10);
  pSVar22 = (this->m_tcsOutputs).
            super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_tcsOutputs).
                              super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22) >> 4)) {
    lVar33 = 0;
    lVar39 = 0;
    do {
      plVar14 = *(long **)((long)&pSVar22->m_ptr + lVar33);
      IVar4 = this->m_ioType;
      if ((uint)local_408 < 4) {
        if (IVar4 != IO_TYPE_PER_PATCH) {
          if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
            iVar12 = 3;
            goto LAB_01422375;
          }
          if (IVar4 != IO_TYPE_PER_PATCH_BLOCK) {
            iVar12 = (uint)(IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 4 + -2;
            goto LAB_014223b9;
          }
        }
        (**(code **)(*plVar14 + 0x18))(local_458);
        plVar20 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_458,0,(char *)0x0,(ulong)local_178);
        local_3d8._0_8_ = local_3c8;
        ppuVar29 = (undefined **)(plVar20 + 2);
        if ((undefined **)*plVar20 == ppuVar29) {
          local_3c8._0_8_ = *ppuVar29;
          local_3c8._8_8_ = plVar20[3];
        }
        else {
          local_3c8._0_8_ = *ppuVar29;
          local_3d8._0_8_ = (undefined **)*plVar20;
        }
        local_3d8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar20 + 1);
        *plVar20 = (long)ppuVar29;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_168._M_left,local_3d8._0_8_);
        if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
          operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
        }
        if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
          operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
        }
        bVar9 = true;
        iVar12 = 1;
      }
      else {
        iVar12 = -1;
        if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
LAB_01422375:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
          std::ostream::operator<<((ostringstream *)local_3d8,3);
          std::__cxx11::stringbuf::str();
LAB_01422431:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
          std::ios_base::~ios_base(local_368);
        }
        else {
LAB_014223b9:
          if (IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
            std::ostream::operator<<((ostringstream *)local_3d8,2);
            std::__cxx11::stringbuf::str();
            goto LAB_01422431;
          }
          TVar5 = local_410->m_tessControlOutArraySize;
          if (TVar5 == TESS_CONTROL_OUT_ARRAY_SIZE_QUERY) {
            pCVar6 = ((local_410->super_TestCase).m_context)->m_contextInfo;
            iVar11 = (*pCVar6->_vptr_ContextInfo[2])(pCVar6,0x8e7d);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
            std::ostream::operator<<((ostringstream *)local_3d8,iVar11);
            std::__cxx11::stringbuf::str();
            goto LAB_01422431;
          }
          if (TVar5 == TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
            std::ostream::operator<<((ostringstream *)local_3d8,5);
            std::__cxx11::stringbuf::str();
            goto LAB_01422431;
          }
          pcVar32 = "";
          if (TVar5 == TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN) {
            pcVar32 = "gl_MaxPatchVertices";
          }
          local_480 = (undefined1  [8])((long)local_478 + 8);
          pcVar35 = pcVar32 + 0x13;
          if (TVar5 != TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN) {
            pcVar35 = pcVar32;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_480,pcVar32,pcVar35);
        }
        (**(code **)(*plVar14 + 0x20))(local_4b8,plVar14,local_480);
        plVar20 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_4b8,0,(char *)0x0,(ulong)local_178);
        local_458._0_8_ = local_458 + 0x10;
        psVar26 = (size_type *)(plVar20 + 2);
        if ((size_type *)*plVar20 == psVar26) {
          local_458._16_8_ = *psVar26;
          aStack_440._M_allocated_capacity = plVar20[3];
        }
        else {
          local_458._16_8_ = *psVar26;
          local_458._0_8_ = (size_type *)*plVar20;
        }
        local_458._8_8_ = plVar20[1];
        *plVar20 = (long)psVar26;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_168._M_left,local_458._0_8_);
        if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
          operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
        }
        if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
          operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
        }
        if (local_480 != (undefined1  [8])((long)local_478 + 8)) {
          operator_delete((void *)local_480,(ulong)((long)local_470 + 1));
        }
        if (3 < (uint)local_408) {
          iVar11 = (**(code **)(*plVar14 + 0x38))(plVar14);
          de::floatToString_abi_cxx11_
                    ((string *)local_4b8,(de *)&DAT_00000001,(float)iVar11 * 0.4,precision);
          plVar20 = (long *)std::__cxx11::string::replace((ulong)local_4b8,0,(char *)0x0,0x1c4209c);
          local_458._0_8_ = local_458 + 0x10;
          psVar26 = (size_type *)(plVar20 + 2);
          if ((size_type *)*plVar20 == psVar26) {
            local_458._16_8_ = *psVar26;
            aStack_440._M_allocated_capacity = plVar20[3];
          }
          else {
            local_458._16_8_ = *psVar26;
            local_458._0_8_ = (size_type *)*plVar20;
          }
          local_458._8_8_ = plVar20[1];
          *plVar20 = (long)psVar26;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          plVar20 = (long *)std::__cxx11::string::append(local_458);
          local_3d8._0_8_ = local_3c8;
          ppuVar29 = (undefined **)(plVar20 + 2);
          if ((undefined **)*plVar20 == ppuVar29) {
            local_3c8._0_8_ = *ppuVar29;
            local_3c8._8_8_ = plVar20[3];
          }
          else {
            local_3c8._0_8_ = *ppuVar29;
            local_3d8._0_8_ = (undefined **)*plVar20;
          }
          local_3d8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar20 + 1);
          *plVar20 = (long)ppuVar29;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          std::__cxx11::string::_M_append(local_1e8 + 0x10,local_3d8._0_8_);
          if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
            operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
          }
          if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
            operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
          }
          if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
            operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
          }
        }
        bVar9 = false;
      }
      (**(code **)(*plVar14 + 0x10))(local_4b8);
      plVar20 = (long *)std::__cxx11::string::replace((ulong)local_4b8,0,(char *)0x0,0x1c420bb);
      local_458._0_8_ = local_458 + 0x10;
      psVar26 = (size_type *)(plVar20 + 2);
      if ((size_type *)*plVar20 == psVar26) {
        local_458._16_8_ = *psVar26;
        aStack_440._M_allocated_capacity = plVar20[3];
      }
      else {
        local_458._16_8_ = *psVar26;
        local_458._0_8_ = (size_type *)*plVar20;
      }
      local_458._8_8_ = plVar20[1];
      *plVar20 = (long)psVar26;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      plVar20 = (long *)std::__cxx11::string::append(local_458);
      local_3d8._0_8_ = local_3c8;
      ppuVar29 = (undefined **)(plVar20 + 2);
      if ((undefined **)*plVar20 == ppuVar29) {
        local_3c8._0_8_ = *ppuVar29;
        local_3c8._8_8_ = plVar20[3];
      }
      else {
        local_3c8._0_8_ = *ppuVar29;
        local_3d8._0_8_ = (undefined **)*plVar20;
      }
      local_3d8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar20 + 1);
      *plVar20 = (long)ppuVar29;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      std::__cxx11::string::_M_append(local_1e8 + 0x10,local_3d8._0_8_);
      if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
      }
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
        operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
      }
      if (bVar9) {
        (**(code **)(*plVar14 + 0x30))(local_3d8,plVar14,2,glslAssignBasicTypeObject);
        this = local_410;
        std::__cxx11::string::_M_append(local_1e8 + 0x10,local_3d8._0_8_);
      }
      else {
        (**(code **)(*plVar14 + 0x28))(local_3d8,plVar14,iVar12,2,glslAssignBasicTypeObject);
        std::__cxx11::string::_M_append(local_1e8 + 0x10,local_3d8._0_8_);
        this = local_410;
      }
      if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
      }
      if (3 < (uint)local_408) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
        std::ostream::operator<<((string *)local_3d8,5);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
        std::ios_base::~ios_base(local_368);
        plVar20 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x1c420da);
        local_400 = &local_3f8._M_string_length;
        psVar26 = (size_type *)(plVar20 + 2);
        if ((size_type *)*plVar20 == psVar26) {
          local_3f8._M_string_length = *psVar26;
          local_3f8.field_2._M_allocated_capacity = plVar20[3];
        }
        else {
          local_3f8._M_string_length = *psVar26;
          local_400 = (size_type *)*plVar20;
        }
        local_3f8._M_dataplus._M_p = (pointer)plVar20[1];
        *plVar20 = (long)psVar26;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        paVar21 = (anon_struct_8_2_bfd9d0cb_for_basic *)
                  std::__cxx11::string::append((char *)&local_400);
        local_480 = (undefined1  [8])((long)local_478 + 8);
        aVar17 = (anon_struct_8_2_bfd9d0cb_for_basic)(paVar21 + 2);
        if (*paVar21 == aVar17) {
          local_470 = *(undefined1 (*) [8])aVar17;
          auStack_468._0_8_ = paVar21[3];
        }
        else {
          local_470 = *(undefined1 (*) [8])aVar17;
          local_480 = (undefined1  [8])*paVar21;
        }
        local_478 = *(undefined1 (*) [8])(paVar21 + 1);
        *paVar21 = aVar17;
        paVar21[1].type = TYPE_INVALID;
        paVar21[1].precision = PRECISION_LOWP;
        *(undefined1 *)&paVar21[2].type = TYPE_INVALID;
        iVar12 = (**(code **)(*plVar14 + 0x38))(plVar14);
        de::floatToString_abi_cxx11_
                  ((string *)local_3d8,(de *)&DAT_00000001,(float)iVar12 * 0.4,precision_00);
        auVar36 = (undefined1  [8])(undefined1 *)0xf;
        if (local_480 != (undefined1  [8])((long)local_478 + 8)) {
          auVar36 = local_470;
        }
        puVar3 = (undefined1 *)((long)(Type *)local_3d8._8_8_ + (long)local_478);
        if ((ulong)auVar36 < puVar3) {
          puVar37 = (undefined1 *)0xf;
          if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
            puVar37 = (undefined1 *)local_3c8._0_8_;
          }
          if (puVar37 < puVar3) goto LAB_01422ace;
          plVar14 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_3d8,0,(char *)0x0,(ulong)local_480);
        }
        else {
LAB_01422ace:
          plVar14 = (long *)std::__cxx11::string::_M_append(local_480,local_3d8._0_8_);
        }
        local_4b8._0_8_ = local_4a8;
        pMVar18 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pMVar18) {
          local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
          local_4a8._8_8_ = plVar14[3];
        }
        else {
          local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
          local_4b8._0_8_ = (pointer)*plVar14;
        }
        local_4b8._8_8_ = plVar14[1];
        *plVar14 = (long)pMVar18;
        plVar14[1] = 0;
        *(undefined1 *)&(pMVar18->name)._M_dataplus._M_p = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_4b8);
        local_458._0_8_ = local_458 + 0x10;
        psVar26 = (size_type *)(plVar14 + 2);
        if ((size_type *)*plVar14 == psVar26) {
          local_458._16_8_ = *psVar26;
          aStack_440._M_allocated_capacity = plVar14[3];
        }
        else {
          local_458._16_8_ = *psVar26;
          local_458._0_8_ = (size_type *)*plVar14;
        }
        local_458._8_8_ = plVar14[1];
        *plVar14 = (long)psVar26;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::string::_M_append(local_1e8 + 0x10,local_458._0_8_);
        if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
          operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
        }
        if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
          operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
        }
        if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
          operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
        }
        if (local_480 != (undefined1  [8])((long)local_478 + 8)) {
          operator_delete((void *)local_480,(ulong)((long)local_470 + 1));
        }
        if (local_400 != &local_3f8._M_string_length) {
          operator_delete(local_400,local_3f8._M_string_length + 1);
        }
        if (local_1f8[0] != (ContextInfo *)local_1e8) {
          operator_delete(local_1f8[0],local_1e8._0_8_ + 1);
        }
      }
      lVar39 = lVar39 + 1;
      pSVar22 = (this->m_tcsOutputs).
                super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar33 = lVar33 + 0x10;
    } while (lVar39 < (int)((ulong)((long)(this->m_tcsOutputs).
                                          super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22
                                   ) >> 4));
  }
  std::__cxx11::string::append(local_1e8 + 0x10);
  if (local_481 != '\0') {
    glu::decl::DeclareStructType::DeclareStructType
              ((DeclareStructType *)local_458,(StructType *)local_108._16_8_,0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
    glu::decl::operator<<((ostream *)local_3d8,(DeclareStructType *)local_458);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
    std::ios_base::~ios_base(local_368);
    plVar14 = (long *)std::__cxx11::string::append(local_480);
    local_4b8._0_8_ = local_4a8;
    pMVar18 = (pointer)(plVar14 + 2);
    if ((pointer)*plVar14 == pMVar18) {
      local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
      local_4a8._8_8_ = plVar14[3];
    }
    else {
      local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
      local_4b8._0_8_ = (pointer)*plVar14;
    }
    local_4b8._8_8_ = plVar14[1];
    *plVar14 = (long)pMVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_118,local_4b8._0_8_);
    if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
      operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
    }
    if (local_480 != (undefined1  [8])((long)local_478 + 8)) {
      operator_delete((void *)local_480,(ulong)((long)local_470 + 1));
    }
    glu::StructType::~StructType((StructType *)local_458);
  }
  std::__cxx11::string::append(local_1b8._M_local_buf);
  pSVar22 = (this->m_tesInputs).
            super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_tesInputs).
                              super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22) >> 4)) {
    local_23c = local_23c - VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN;
    lVar33 = 0;
    lVar39 = 0;
    do {
      plVar14 = *(long **)((long)&pSVar22->m_ptr + lVar33);
      IVar4 = this->m_ioType;
      if ((uint)local_408 < 4) {
        if (IVar4 != IO_TYPE_PER_PATCH) {
          if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
            iVar12 = 3;
            goto LAB_01422f38;
          }
          if (IVar4 != IO_TYPE_PER_PATCH_BLOCK) {
            iVar12 = (uint)(IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 4 + -2;
            goto LAB_01422f71;
          }
        }
        (**(code **)(*plVar14 + 0x18))(local_458);
        plVar20 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_458,0,(char *)0x0,(ulong)local_198);
        local_3d8._0_8_ = local_3c8;
        ppuVar29 = (undefined **)(plVar20 + 2);
        if ((undefined **)*plVar20 == ppuVar29) {
          local_3c8._0_8_ = *ppuVar29;
          local_3c8._8_8_ = plVar20[3];
        }
        else {
          local_3c8._0_8_ = *ppuVar29;
          local_3d8._0_8_ = (undefined **)*plVar20;
        }
        local_3d8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar20 + 1);
        *plVar20 = (long)ppuVar29;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_118,local_3d8._0_8_);
        if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
          operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
        }
        if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
          operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
        }
        iVar12 = 1;
        bVar9 = true;
      }
      else {
        iVar12 = 5;
        if (IVar4 == IO_TYPE_PER_PATCH_ARRAY) {
LAB_01422f38:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
          std::ostream::operator<<((ostringstream *)local_3d8,3);
          std::__cxx11::stringbuf::str();
LAB_01422fdf:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
          std::ios_base::~ios_base(local_368);
        }
        else {
LAB_01422f71:
          if (IVar4 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
            std::ostream::operator<<((ostringstream *)local_3d8,2);
            std::__cxx11::stringbuf::str();
            goto LAB_01422fdf;
          }
          if (local_23c < VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3d8,local_138._M_dataplus._M_p,local_138._M_string_length);
            std::__cxx11::stringbuf::str();
            goto LAB_01422fdf;
          }
          local_480 = (undefined1  [8])((long)local_478 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_480,0x1aee929);
        }
        (**(code **)(*plVar14 + 0x20))(local_4b8,plVar14,local_480);
        plVar20 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_4b8,0,(char *)0x0,(ulong)local_198);
        local_458._0_8_ = local_458 + 0x10;
        psVar26 = (size_type *)(plVar20 + 2);
        if ((size_type *)*plVar20 == psVar26) {
          local_458._16_8_ = *psVar26;
          aStack_440._M_allocated_capacity = plVar20[3];
        }
        else {
          local_458._16_8_ = *psVar26;
          local_458._0_8_ = (size_type *)*plVar20;
        }
        local_458._8_8_ = plVar20[1];
        *plVar20 = (long)psVar26;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_118,local_458._0_8_);
        if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
          operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
        }
        if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
          operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
        }
        if (local_480 != (undefined1  [8])((long)local_478 + 8)) {
          operator_delete((void *)local_480,(ulong)((long)local_470 + 1));
        }
        bVar9 = false;
      }
      (**(code **)(*plVar14 + 0x10))(local_4b8);
      plVar20 = (long *)std::__cxx11::string::replace((ulong)local_4b8,0,(char *)0x0,0x1c42154);
      local_458._0_8_ = local_458 + 0x10;
      psVar26 = (size_type *)(plVar20 + 2);
      if ((size_type *)*plVar20 == psVar26) {
        local_458._16_8_ = *psVar26;
        aStack_440._M_allocated_capacity = plVar20[3];
      }
      else {
        local_458._16_8_ = *psVar26;
        local_458._0_8_ = (size_type *)*plVar20;
      }
      local_458._8_8_ = plVar20[1];
      *plVar20 = (long)psVar26;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      plVar20 = (long *)std::__cxx11::string::append(local_458);
      local_3d8._0_8_ = local_3c8;
      ppuVar29 = (undefined **)(plVar20 + 2);
      if ((undefined **)*plVar20 == ppuVar29) {
        local_3c8._0_8_ = *ppuVar29;
        local_3c8._8_8_ = plVar20[3];
      }
      else {
        local_3c8._0_8_ = *ppuVar29;
        local_3d8._0_8_ = (undefined **)*plVar20;
      }
      local_3d8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar20 + 1);
      *plVar20 = (long)ppuVar29;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      std::__cxx11::string::_M_append(local_1b8._M_local_buf,local_3d8._0_8_);
      if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
      }
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
      }
      if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
        operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
      }
      if (bVar9) {
        (**(code **)(*plVar14 + 0x30))(local_3d8,plVar14,2,glslCheckBasicTypeObject);
        std::__cxx11::string::_M_append(local_1b8._M_local_buf,local_3d8._0_8_);
      }
      else {
        (**(code **)(*plVar14 + 0x28))(local_3d8,plVar14,iVar12,2,glslCheckBasicTypeObject);
        std::__cxx11::string::_M_append(local_1b8._M_local_buf,local_3d8._0_8_);
      }
      if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
      }
      lVar39 = lVar39 + 1;
      pSVar22 = (local_410->m_tesInputs).
                super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar33 = lVar33 + 0x10;
      this = local_410;
    } while (lVar39 < (int)((ulong)((long)(local_410->m_tesInputs).
                                          super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22
                                   ) >> 4));
  }
  pcVar34 = local_458 + 0x10;
  std::__cxx11::string::append(local_1b8._M_local_buf);
  glu::VarType::~VarType((VarType *)local_260);
  glu::VarType::~VarType((VarType *)&local_218);
  local_1f8[0] = (ContextInfo *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f8,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
  std::ostream::operator<<(local_3d8,5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
  std::ios_base::~ios_base(local_368);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,0x1c3c847);
  pCVar7 = (Context *)(local_260 + 0x10);
  pCVar31 = (Context *)(plVar14 + 2);
  if ((Context *)*plVar14 == pCVar31) {
    local_260._16_8_ = pCVar31->m_testCtx;
    lStack_248 = plVar14[3];
    local_260._0_8_ = pCVar7;
  }
  else {
    local_260._16_8_ = pCVar31->m_testCtx;
    local_260._0_8_ = (Context *)*plVar14;
  }
  local_260._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar14 + 1);
  *plVar14 = (long)pCVar31;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_260);
  psVar26 = &local_3f8._M_string_length;
  psVar30 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar30) {
    local_3f8._M_string_length = *psVar30;
    local_3f8.field_2._M_allocated_capacity = plVar14[3];
    local_400 = psVar26;
  }
  else {
    local_3f8._M_string_length = *psVar30;
    local_400 = (size_type *)*plVar14;
  }
  local_3f8._M_dataplus._M_p = (pointer)plVar14[1];
  *plVar14 = (long)psVar30;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_168._M_left);
  local_480 = (undefined1  [8])(local_478 + 8);
  pSVar38 = (StructType *)(plVar14 + 2);
  if ((StructType *)*plVar14 == pSVar38) {
    local_470 = (undefined1  [8])(pSVar38->m_typeName)._M_dataplus._M_p;
    auStack_468._0_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar14 + 3);
  }
  else {
    local_470 = (undefined1  [8])(pSVar38->m_typeName)._M_dataplus._M_p;
    local_480 = (undefined1  [8])*plVar14;
  }
  local_478 = *(undefined1 (*) [8])(plVar14 + 1);
  *plVar14 = (long)pSVar38;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_480);
  local_4b8._0_8_ = local_4a8;
  pMVar18 = (pointer)(plVar14 + 2);
  if ((pointer)*plVar14 == pMVar18) {
    local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
    local_4a8._8_8_ = plVar14[3];
  }
  else {
    local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
    local_4b8._0_8_ = (pointer)*plVar14;
  }
  local_4b8._8_8_ = plVar14[1];
  *plVar14 = (long)pMVar18;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append(local_4b8,local_1e8._16_8_);
  psVar30 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar30) {
    local_458._16_8_ = *psVar30;
    aStack_440._M_allocated_capacity = plVar14[3];
    local_458._0_8_ = pcVar34;
  }
  else {
    local_458._16_8_ = *psVar30;
    local_458._0_8_ = (size_type *)*plVar14;
  }
  local_458._8_8_ = plVar14[1];
  *plVar14 = (long)psVar30;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_458);
  local_218 = (Context *)(local_210 + 8);
  pCVar31 = (Context *)(plVar14 + 2);
  if ((Context *)*plVar14 == pCVar31) {
    local_210._8_8_ = pCVar31->m_testCtx;
    lStack_200 = plVar14[3];
  }
  else {
    local_210._8_8_ = pCVar31->m_testCtx;
    local_218 = (Context *)*plVar14;
  }
  aVar17 = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar14 + 1);
  *plVar14 = (long)pCVar31;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  local_210._0_8_ = aVar17;
  if ((pointer)local_458._0_8_ != pcVar34) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
    aVar17 = extraout_RDX;
  }
  usePointMode = SUB81(pCVar31,0);
  primType = aVar17.type;
  if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
    operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
    primType = extraout_EDX;
  }
  if (local_480 != (undefined1  [8])(local_478 + 8)) {
    operator_delete((void *)local_480,(long)local_470 + 1);
    primType = extraout_EDX_00;
  }
  if (local_400 != psVar26) {
    operator_delete(local_400,local_3f8._M_string_length + 1);
    primType = extraout_EDX_01;
  }
  if ((Context *)local_260._0_8_ != pCVar7) {
    operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
    primType = extraout_EDX_02;
  }
  pCVar31 = (Context *)(local_238 + 0x10);
  if ((Context *)local_238._0_8_ != pCVar31) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    primType = extraout_EDX_03;
  }
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_238,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,primType,
             (bool)usePointMode);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,0x1c3bf3f);
  psVar30 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar30) {
    local_3f8._M_string_length = *psVar30;
    local_3f8.field_2._M_allocated_capacity = plVar14[3];
    local_400 = psVar26;
  }
  else {
    local_3f8._M_string_length = *psVar30;
    local_400 = (size_type *)*plVar14;
  }
  local_3f8._M_dataplus._M_p = (pointer)plVar14[1];
  *plVar14 = (long)psVar30;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_400);
  local_480 = (undefined1  [8])(local_478 + 8);
  pSVar38 = (StructType *)(plVar14 + 2);
  if ((StructType *)*plVar14 == pSVar38) {
    local_470 = (undefined1  [8])(pSVar38->m_typeName)._M_dataplus._M_p;
    auStack_468._0_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar14 + 3);
  }
  else {
    local_470 = (undefined1  [8])(pSVar38->m_typeName)._M_dataplus._M_p;
    local_480 = (undefined1  [8])*plVar14;
  }
  local_478 = *(undefined1 (*) [8])(plVar14 + 1);
  *plVar14 = (long)pSVar38;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append(local_480,(ulong)local_118);
  local_4b8._0_8_ = local_4a8;
  pMVar18 = (pointer)(plVar14 + 2);
  if ((pointer)*plVar14 == pMVar18) {
    local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
    local_4a8._8_8_ = plVar14[3];
  }
  else {
    local_4a8._0_8_ = (pMVar18->name)._M_dataplus._M_p;
    local_4b8._0_8_ = (pointer)*plVar14;
  }
  local_4b8._8_8_ = plVar14[1];
  *plVar14 = (long)pMVar18;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_4b8);
  psVar30 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar30) {
    local_458._16_8_ = *psVar30;
    aStack_440._M_allocated_capacity = plVar14[3];
    local_458._0_8_ = pcVar34;
  }
  else {
    local_458._16_8_ = *psVar30;
    local_458._0_8_ = (size_type *)*plVar14;
  }
  local_458._8_8_ = plVar14[1];
  *plVar14 = (long)psVar30;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::_M_append(local_458,local_1b8._M_allocated_capacity);
  local_3d8._0_8_ = local_3c8;
  psVar30 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar30) {
    local_3c8._0_8_ = *psVar30;
    local_3c8._8_8_ = plVar14[3];
  }
  else {
    local_3c8._0_8_ = *psVar30;
    local_3d8._0_8_ = (size_type *)*plVar14;
  }
  local_3d8._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar14 + 1);
  *plVar14 = (long)psVar30;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_3d8);
  code = (Context *)(plVar14 + 2);
  if ((Context *)*plVar14 == code) {
    local_260._16_8_ = code->m_testCtx;
    lStack_248 = plVar14[3];
    local_260._0_8_ = pCVar7;
  }
  else {
    local_260._16_8_ = code->m_testCtx;
    local_260._0_8_ = (Context *)*plVar14;
  }
  local_260._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar14 + 1);
  *plVar14 = (long)code;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((undefined1 *)local_3d8._0_8_ != local_3c8) {
    operator_delete((void *)local_3d8._0_8_,local_3c8._0_8_ + 1);
  }
  if ((pointer)local_458._0_8_ != pcVar34) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
    operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
  }
  if (local_480 != (undefined1  [8])((long)local_478 + 8)) {
    operator_delete((void *)local_480,(long)local_470 + 1);
  }
  if (local_400 != psVar26) {
    operator_delete(local_400,local_3f8._M_string_length + 1);
  }
  if ((Context *)local_238._0_8_ != pCVar31) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  local_238._0_8_ = pCVar31;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  local_408 = (ShaderProgram *)operator_new(0xd0);
  pCVar7 = (this->super_TestCase).m_context;
  renderCtx = pCVar7->m_renderCtx;
  memset(local_3d8,0,0xac);
  local_328._0_8_ = (pointer)0x0;
  local_328[8] = 0;
  local_328._9_7_ = 0;
  local_328[0x10] = 0;
  local_328._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_e0 + 0x10),(_anonymous_namespace_ *)pCVar7->m_renderCtx,
             (Context *)local_1f8[0],(char *)code);
  local_458._0_8_ = local_458._0_8_ & 0xffffffff00000000;
  local_458._8_8_ = &aStack_440;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_458 + 8),local_e0._16_8_,(undefined1 *)(local_e0._16_8_ + local_c8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3d8 + (local_458._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_458 + 8));
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)((local_410->super_TestCase).m_context)->m_renderCtx
             ,local_218,(char *)code);
  local_4b8._0_4_ = 3;
  local_4b8._8_8_ = local_4a8 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4b8 + 8),local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3d8 + (local_4b8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_4b8 + 8));
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)((local_410->super_TestCase).m_context)->m_renderCtx
             ,(Context *)local_260._0_8_,(char *)code);
  local_480._0_4_ = TYPE_FLOAT_VEC4;
  local_478 = (undefined1  [8])(local_470 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_478,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3d8 + ((ulong)local_480 & 0xffffffff) * 0x18),(value_type *)local_478);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_90,(_anonymous_namespace_ *)((local_410->super_TestCase).m_context)->m_renderCtx
             ,(Context *)local_238._0_8_,(char *)code);
  local_400 = (size_type *)CONCAT44(local_400._4_4_,1);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3d8 + ((ulong)local_400 & 0xffffffff) * 0x18),&local_3f8);
  local_f0 = (_Base_ptr)local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"out_te_firstFailedInputIndex","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_f0,(undefined1 *)((long)&local_f0->_M_color + local_e8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328,&local_b0);
  local_330 = 0x8c8c;
  glu::ShaderProgram::ShaderProgram(local_408,renderCtx,(ProgramSources *)local_3d8);
  pSVar23 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar2 = &pSVar23->strongRefCount;
  pSVar23->strongRefCount = 0;
  pSVar23->weakRefCount = 0;
  pSVar23->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0212cb98;
  pSVar23[1]._vptr_SharedPtrStateBase = (_func_int **)local_408;
  pSVar23->strongRefCount = 1;
  pSVar23->weakRefCount = 1;
  pSVar8 = (local_410->m_program).m_state;
  if (pSVar8 != pSVar23) {
    if (pSVar8 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar40 = &pSVar8->strongRefCount;
      *pdVar40 = *pdVar40 + -1;
      UNLOCK();
      if (*pdVar40 == 0) {
        (local_410->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((local_410->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar40 = &((local_410->m_program).m_state)->weakRefCount;
      *pdVar40 = *pdVar40 + -1;
      UNLOCK();
      if (*pdVar40 == 0) {
        pSVar8 = (local_410->m_program).m_state;
        if (pSVar8 != (SharedPtrStateBase *)0x0) {
          (*pSVar8->_vptr_SharedPtrStateBase[1])();
        }
        (local_410->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (local_410->m_program).m_ptr = local_408;
    (local_410->m_program).m_state = pSVar23;
    LOCK();
    pSVar23->strongRefCount = pSVar23->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar40 = &((local_410->m_program).m_state)->weakRefCount;
    *pdVar40 = *pdVar40 + 1;
    UNLOCK();
  }
  pdVar40 = &pSVar23->weakRefCount;
  LOCK();
  *pdVar2 = *pdVar2 + -1;
  UNLOCK();
  if (*pdVar2 == 0) {
    (*pSVar23->_vptr_SharedPtrStateBase[2])(pSVar23);
  }
  LOCK();
  *pdVar40 = *pdVar40 + -1;
  UNLOCK();
  if (*pdVar40 == 0) {
    (*pSVar23->_vptr_SharedPtrStateBase[1])(pSVar23);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pUVar10 = local_410;
  if (local_f0 != (_Base_ptr)local_e0) {
    operator_delete(local_f0,local_e0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_478 != (undefined1  [8])((long)local_470 + 8)) {
    operator_delete((void *)local_478,auStack_468._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_4b8._8_8_ != (pointer)(local_4a8 + 8)) {
    operator_delete((void *)local_4b8._8_8_,local_4a8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._8_8_ != &aStack_440) {
    operator_delete((void *)local_458._8_8_,aStack_440._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._16_8_ != &local_c0) {
    operator_delete((void *)local_e0._16_8_,local_c0._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_328);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_348);
  lVar33 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3d8 + lVar33));
    lVar33 = lVar33 + -0x18;
  } while (lVar33 != -0x18);
  glu::operator<<(((pUVar10->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (pUVar10->m_program).m_ptr);
  if ((((pUVar10->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if ((Context *)local_238._0_8_ != (Context *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if ((Context *)local_260._0_8_ != (Context *)(local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
    }
    if (local_218 != (Context *)(local_210 + 8)) {
      operator_delete(local_218,(ulong)(local_210._8_8_ + 1));
    }
    if (local_1f8[0] != (ContextInfo *)local_1e8) {
      operator_delete(local_1f8[0],local_1e8._0_8_ + 1);
    }
    if ((bool *)local_1b8._M_allocated_capacity != &local_1a8) {
      operator_delete((void *)local_1b8._M_allocated_capacity,CONCAT71(uStack_1a7,local_1a8) + 1);
    }
    if (local_118 != (_Base_ptr)local_108) {
      operator_delete(local_118,CONCAT71(local_108._1_7_,local_108[0]) + 1);
    }
    if ((pointer)local_1e8._16_8_ != (pointer)(local_1e8 + 0x20)) {
      operator_delete((void *)local_1e8._16_8_,CONCAT71(uStack_1c7,local_1e8[0x20]) + 1);
    }
    if (local_168._M_left != (_Base_ptr)local_148) {
      operator_delete(local_168._M_left,CONCAT71(local_148._1_7_,local_148[0]) + 1);
    }
    if (local_198 != (_Base_ptr)&local_188) {
      operator_delete(local_198,(ulong)((long)&local_188->_M_color + 1));
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168._0_8_ + 1);
    }
    paVar24 = &local_138.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar24) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      paVar24 = extraout_RAX;
    }
    return (int)paVar24;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x183e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UserDefinedIOCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const bool			isPerPatchIO				= m_ioType == IO_TYPE_PER_PATCH				||
													  m_ioType == IO_TYPE_PER_PATCH_ARRAY		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	const bool			isExplicitVertexArraySize	= m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN ||
													  m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY;

	const string		vertexAttrArrayInputSize	= m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_IMPLICIT					? ""
													: m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN	? "gl_MaxPatchVertices"
													: m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY			? de::toString(m_context.getContextInfo().getInt(GL_MAX_PATCH_VERTICES))
													: DE_NULL;

	const char* const	maybePatch					= isPerPatchIO ? "patch " : "";
	const string		outMaybePatch				= string() + maybePatch + "out ";
	const string		inMaybePatch				= string() + maybePatch + "in ";
	const bool			useBlock					= m_ioType == IO_TYPE_PER_VERTEX_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	string				tcsDeclarations;
	string				tcsStatements;

	string				tesDeclarations;
	string				tesStatements;

	{
		m_structTypes.push_back(glu::StructType("S"));

		const glu::VarType	highpFloat		(glu::TYPE_FLOAT, glu::PRECISION_HIGHP);
		glu::StructType&	structType		= m_structTypes.back();
		const glu::VarType	structVarType	(&structType);
		bool				usedStruct		= false;

		structType.addMember("x", glu::VarType(glu::TYPE_INT, glu::PRECISION_HIGHP));
		structType.addMember("y", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		if (useBlock)
		{
			// It is illegal to have a structure containing an array as an output variable
			structType.addMember("z", glu::VarType(highpFloat, 2));
		}

		if (useBlock)
		{
			const bool				useLightweightBlock = (m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY); // use leaner block to make sure it is not larger than allowed (per-patch storage is very limited)
			vector<IOBlock::Member>	blockMembers;

			if (!useLightweightBlock)
				blockMembers.push_back(IOBlock::Member("blockS",	structVarType));

			blockMembers.push_back(IOBlock::Member("blockFa",	glu::VarType(highpFloat, 3)));
			blockMembers.push_back(IOBlock::Member("blockSa",	glu::VarType(structVarType, 2)));
			blockMembers.push_back(IOBlock::Member("blockF",	highpFloat));

			m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "tcBlock", blockMembers)));
			m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "teBlock", blockMembers)));

			usedStruct = true;
		}
		else
		{
			const Variable var0("in_te_s", structVarType,	m_ioType != IO_TYPE_PER_PATCH);
			const Variable var1("in_te_f", highpFloat,		m_ioType != IO_TYPE_PER_PATCH);

			if (m_ioType != IO_TYPE_PER_PATCH_ARRAY)
			{
				// Arrays of structures are disallowed, add struct cases only if not arrayed variable
				m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var0)));
				m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var0)));

				usedStruct = true;
			}

			m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var1)));
			m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var1)));
		}

		tcsDeclarations += "in " + Variable("in_tc_attr", highpFloat, true).declareArray(vertexAttrArrayInputSize);

		if (usedStruct)
			tcsDeclarations += de::toString(glu::declare(structType)) + ";\n";

		tcsStatements += "\t{\n"
						 "\t\thighp float v = 1.3;\n";

		for (int tcsOutputNdx = 0; tcsOutputNdx < (int)m_tcsOutputs.size(); tcsOutputNdx++)
		{
			const TopLevelObject&	output		= *m_tcsOutputs[tcsOutputNdx];
			const int				numElements	= !isPerPatchIO								? -1	//!< \note -1 means indexing with gl_InstanceID
												: m_ioType == IO_TYPE_PER_PATCH				? 1
												: m_ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: -2;
			const bool				isArray		= (numElements != 1);

			DE_ASSERT(numElements != -2);

			if (isArray)
			{
				tcsDeclarations += outMaybePatch + output.declareArray(m_ioType == IO_TYPE_PER_PATCH_ARRAY											? de::toString(int(NUM_PER_PATCH_ARRAY_ELEMS))
																	   : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY									? de::toString(int(NUM_PER_PATCH_BLOCKS))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT			? de::toString(int(NUM_OUTPUT_VERTICES))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_QUERY				? de::toString(m_context.getContextInfo().getInt(GL_MAX_PATCH_VERTICES))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN	? "gl_MaxPatchVertices"
																	   : "");
			}
			else
				tcsDeclarations += outMaybePatch + output.declare();

			if (!isPerPatchIO)
				tcsStatements += "\t\tv += float(gl_InvocationID)*" + de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) + ";\n";

			tcsStatements += "\n\t\t// Assign values to output " + output.name() + "\n";
			if (isArray)
				tcsStatements += output.glslTraverseBasicTypeArray(numElements, 2, glslAssignBasicTypeObject);
			else
				tcsStatements += output.glslTraverseBasicType(2, glslAssignBasicTypeObject);

			if (!isPerPatchIO)
				tcsStatements += "\t\tv += float(" + de::toString(int(NUM_OUTPUT_VERTICES)) + "-gl_InvocationID-1)*" + de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) + ";\n";
		}
		tcsStatements += "\t}\n";

		if (usedStruct)
			tesDeclarations += de::toString(glu::declare(structType)) + ";\n";

		tesStatements += "\tbool allOk = true;\n"
						 "\thighp uint firstFailedInputIndex = 0u;\n"
						 "\t{\n"
						 "\t\thighp float v = 1.3;\n";
		for (int tesInputNdx = 0; tesInputNdx < (int)m_tesInputs.size(); tesInputNdx++)
		{
			const TopLevelObject&	input		= *m_tesInputs[tesInputNdx];
			const int				numElements	= !isPerPatchIO								? (int)NUM_OUTPUT_VERTICES
												: m_ioType == IO_TYPE_PER_PATCH				? 1
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: -2;
			const bool				isArray		= (numElements != 1);

			DE_ASSERT(numElements != -2);

			if (isArray)
				tesDeclarations += inMaybePatch + input.declareArray(m_ioType == IO_TYPE_PER_PATCH_ARRAY			? de::toString(int(NUM_PER_PATCH_ARRAY_ELEMS))
																	 : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? de::toString(int(NUM_PER_PATCH_BLOCKS))
																	 : isExplicitVertexArraySize					? de::toString(vertexAttrArrayInputSize)
																	 : "");
			else
				tesDeclarations += inMaybePatch + input.declare();

			tesStatements += "\n\t\t// Check values in input " + input.name() + "\n";
			if (isArray)
				tesStatements += input.glslTraverseBasicTypeArray(numElements, 2, glslCheckBasicTypeObject);
			else
				tesStatements += input.glslTraverseBasicType(2, glslCheckBasicTypeObject);
		}
		tesStatements += "\t}\n";
	}

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = " + de::toString(int(NUM_OUTPUT_VERTICES)) + ") out;\n"
												 "\n"
												 + tcsDeclarations +
												 "\n"
												 "patch out highp vec2 in_te_positionScale;\n"
												 "patch out highp vec2 in_te_positionOffset;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tcsStatements +
												 "\n"
												 "	in_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n"
												 "	in_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n"
												 "\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType) +
												 "\n"
												 + tesDeclarations +
												 "\n"
												 "patch in highp vec2 in_te_positionScale;\n"
												 "patch in highp vec2 in_te_positionOffset;\n"
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "// Will contain the index of the first incorrect input,\n"
												 "// or the number of inputs if all are correct\n"
												 "flat out highp uint out_te_firstFailedInputIndex;\n"
												 "\n"
												 "bool compare_int   (int   a, int   b) { return a == b; }\n"
												 "bool compare_float (float a, float b) { return abs(a - b) < 0.01f; }\n"
												 "bool compare_vec4  (vec4  a, vec4  b) { return all(lessThan(abs(a - b), vec4(0.01f))); }\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tesStatements +
												 "\n"
												 "	gl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n"
												 "	in_f_color = allOk ? vec4(0.0, 1.0, 0.0, 1.0)\n"
												 "	                   : vec4(1.0, 0.0, 0.0, 1.0);\n"
												 "	out_te_firstFailedInputIndex = firstFailedInputIndex;\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_firstFailedInputIndex")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}